

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O3

void __thiscall
Clone_unitsBaseUnits_Test::~Clone_unitsBaseUnits_Test(Clone_unitsBaseUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, unitsBaseUnits)
{
    auto u = libcellml::Units::create();

    u->setId("unique_id");
    u->setName("units");
    u->setImportReference("a_url");

    auto uClone = u->clone();

    compareUnits(u, uClone);
}